

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O0

uint RDL_getEdgesForURF(RDL_data *data,uint index,RDL_edge **ptr)

{
  RDL_edge *paRVar1;
  uint *__ptr;
  uint local_44;
  uint i;
  uint *edgeIndices;
  RDL_edge *result;
  uint alloced;
  uint nextfree;
  RDL_edge **ptr_local;
  uint index_local;
  RDL_data *data_local;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
    paRVar1 = (RDL_edge *)malloc(8);
    *ptr = paRVar1;
    data_local._4_4_ = 0xffffffff;
  }
  else if (index < data->nofURFs) {
    result._4_4_ = 0;
    result._0_4_ = 0x40;
    edgeIndices = (uint *)malloc(0x200);
    __ptr = RDL_getEdgesURF(data,index);
    for (local_44 = 0; __ptr[local_44] != 0xffffffff; local_44 = local_44 + 1) {
      if (result._4_4_ == (uint)result) {
        result._0_4_ = (uint)result << 1;
        edgeIndices = (uint *)realloc(edgeIndices,(ulong)(uint)result << 3);
      }
      edgeIndices[(ulong)result._4_4_ * 2] = *data->graph->edges[__ptr[local_44]];
      edgeIndices[(ulong)result._4_4_ * 2 + 1] = data->graph->edges[__ptr[local_44]][1];
      result._4_4_ = result._4_4_ + 1;
    }
    paRVar1 = (RDL_edge *)realloc(edgeIndices,(ulong)result._4_4_ << 3);
    free(__ptr);
    *ptr = paRVar1;
    data_local._4_4_ = result._4_4_;
  }
  else {
    (*RDL_outputFunc)(RDL_ERROR,"invalid index: %u\n",(ulong)index);
    paRVar1 = (RDL_edge *)malloc(8);
    *ptr = paRVar1;
    data_local._4_4_ = 0xffffffff;
  }
  return data_local._4_4_;
}

Assistant:

unsigned RDL_getEdgesForURF(const RDL_data *data, unsigned index, RDL_edge **ptr)
{
  unsigned nextfree, alloced;
  RDL_edge *result;
  unsigned *edgeIndices;
  unsigned i;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    (*ptr) = malloc(sizeof(**ptr));
    return RDL_INVALID_RESULT;
  }

  if (index >= data->nofURFs) {
    RDL_outputFunc(RDL_ERROR, "invalid index: %u\n", index);
    (*ptr) = malloc(sizeof(**ptr));
    return RDL_INVALID_RESULT;
  }

  nextfree = 0;
  alloced = RDL_RESERVED_START;
  result = malloc(alloced * sizeof(*result));
  edgeIndices = RDL_getEdgesURF(data, index);
  /* translate result from edge indices to edges */
  for(i=0; edgeIndices[i]<UINT_MAX; ++i)
  {
    if(nextfree == alloced)/*more space needed in result*/
    {
      alloced *= 2; /* double the space */
      result = realloc(result, alloced * sizeof(*result));
    }
    result[nextfree][0] = data->graph->edges[edgeIndices[i]][0];
    result[nextfree][1] = data->graph->edges[edgeIndices[i]][1];
    ++nextfree;
  }
  result = realloc(result, nextfree * sizeof(*result));
  free(edgeIndices);
  (*ptr) = result;
  return nextfree;
}